

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statsrange.h
# Opt level: O0

CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
 __thiscall
snmalloc::StatsRange::
Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>
::alloc_range(Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>
              *this,size_t size)

{
  Atomic<size_t> AVar1;
  __atomic_base<unsigned_long> _Var2;
  __atomic_base<unsigned_long> _Var3;
  __atomic_base<unsigned_long> _Var4;
  __atomic_base<unsigned_long> _Var5;
  long in_RSI;
  bool bVar6;
  __int_type_conflict curr;
  __int_type_conflict prev;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  result;
  memory_order __b;
  size_t in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  __atomic_base<unsigned_long> local_e0;
  __atomic_base<unsigned_long> local_d8;
  undefined8 local_d0;
  long local_c8;
  void *local_b8;
  __atomic_base<unsigned_long> local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  Atomic<size_t> *local_90;
  __atomic_base<unsigned_long> local_88;
  memory_order local_80;
  undefined4 local_7c;
  Atomic<size_t> *local_78;
  undefined4 local_6c;
  __int_type_conflict local_68;
  __atomic_base<unsigned_long> *local_60;
  Atomic<size_t> *local_58;
  bool local_49;
  __int_type_conflict local_48;
  memory_order local_40;
  undefined4 local_3c;
  __int_type_conflict local_38;
  __atomic_base<unsigned_long> *local_30;
  Atomic<size_t> *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  void **local_8;
  
  local_c8 = in_RSI;
  local_b8 = (void *)CommitRange<snmalloc::PALLinux>::
                     Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
                     ::alloc_range((Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                                   in_stack_fffffffffffffdc8);
  local_18 = &local_d0;
  local_20 = 0;
  local_d0 = 0;
  local_8 = &local_b8;
  local_10 = &local_d0;
  if (local_b8 != (void *)0x0) {
    local_90 = &current_usage;
    local_98 = local_c8;
    local_9c = 5;
    local_a8 = local_c8;
    LOCK();
    UNLOCK();
    local_b0 = current_usage.super___atomic_base<unsigned_long>._M_i;
    local_d8 = current_usage.super___atomic_base<unsigned_long>._M_i;
    local_78 = &peak_usage;
    local_7c = 5;
    current_usage.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         (__atomic_base<unsigned_long>)
         (current_usage.super___atomic_base<unsigned_long>._M_i + local_c8)._M_i;
    local_80 = std::operator&(seq_cst,__memory_order_mask);
    local_88 = peak_usage.super___atomic_base<unsigned_long>._M_i;
    local_e0 = peak_usage.super___atomic_base<unsigned_long>._M_i;
    do {
      if (local_d8._M_i + local_c8 <= local_e0._M_i) {
        return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                )local_b8;
      }
      _Var4._M_i = local_d8._M_i + local_c8;
      local_58 = &peak_usage;
      local_6c = 5;
      local_68 = _Var4._M_i;
      local_60 = &local_e0;
      local_40 = std::__cmpexch_failure_order(relaxed);
      _Var2._M_i = local_e0._M_i;
      AVar1 = peak_usage;
      local_28 = &peak_usage;
      local_3c = 5;
      switch(0x10dd52) {
      default:
        if (local_40 - consume < 2) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else if (local_40 == seq_cst) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        break;
      case 2:
        if (local_40 - consume < 2) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else if (local_40 == seq_cst) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        break;
      case 3:
        if (local_40 - consume < 2) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else if (local_40 == seq_cst) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        break;
      case 4:
        if (local_40 - consume < 2) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else if (local_40 == seq_cst) {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
        else {
          LOCK();
          bVar6 = (__atomic_base<unsigned_long>)local_e0._M_i !=
                  peak_usage.super___atomic_base<unsigned_long>._M_i;
          _Var5._M_i = local_e0._M_i;
          _Var3._M_i = _Var4._M_i;
          if (bVar6) {
            _Var5 = peak_usage.super___atomic_base<unsigned_long>._M_i;
            _Var3 = peak_usage.super___atomic_base<unsigned_long>._M_i;
          }
          peak_usage.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          UNLOCK();
          if (bVar6) {
            local_e0._M_i = _Var5._M_i;
          }
        }
      }
      local_49 = (__atomic_base<unsigned_long>)_Var2._M_i ==
                 AVar1.super___atomic_base<unsigned_long>._M_i;
      local_48 = _Var4._M_i;
      local_38 = _Var4._M_i;
      local_30 = &local_e0;
    } while (!local_49);
  }
  return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          )local_b8;
}

Assistant:

CapPtr<void, ChunkBounds> alloc_range(size_t size)
      {
        auto result = parent.alloc_range(size);
        if (result != nullptr)
        {
          auto prev = current_usage.fetch_add(size);
          auto curr = peak_usage.load();
          while (curr < prev + size)
          {
            if (peak_usage.compare_exchange_weak(curr, prev + size))
              break;
          }
        }
        return result;
      }